

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O3

int __thiscall tcu::CaseTreeNode::findChildNdx(CaseTreeNode *this,string *name)

{
  pointer ppCVar1;
  pointer __s2;
  size_t __n;
  CaseTreeNode *pCVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  ppCVar1 = (this->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(this->m_children).
                               super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1) >> 3);
  if (0 < (int)uVar5) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    uVar4 = 0;
    do {
      pCVar2 = ppCVar1[uVar4];
      if (((pCVar2->m_name)._M_string_length == __n) &&
         ((__n == 0 || (iVar3 = bcmp((pCVar2->m_name)._M_dataplus._M_p,__s2,__n), iVar3 == 0)))) {
        return (int)uVar4;
      }
      uVar4 = uVar4 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar4);
  }
  return -1;
}

Assistant:

int CaseTreeNode::findChildNdx (const std::string& name) const
{
	for (int ndx = 0; ndx < (int)m_children.size(); ++ndx)
	{
		if (m_children[ndx]->getName() == name)
			return ndx;
	}
	return NOT_FOUND;
}